

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall slang::ast::Compilation::resolveDefParamsAndBinds(Compilation *this)

{
  pointer pOVar1;
  bool bVar2;
  RootSymbol *pRVar3;
  ulong uVar4;
  Symbol *this_00;
  ConstantValue *rhs;
  Diagnostic *this_01;
  SyntaxNode *pSVar5;
  size_type sVar6;
  Compilation *visitor;
  ulong uVar7;
  string_view name;
  SourceRange SVar8;
  TimeTraceScope timeScope;
  anon_class_1_0_00000001 local_1dd5;
  uint local_1dd4;
  ulong local_1dd0;
  size_t generateLevel;
  anon_class_8_1_8991fb9c checkProblem;
  anon_class_16_2_9473209d getRange;
  size_t currBlocksSeen;
  size_t numBlocksSeen;
  anon_class_24_3_a558fa90 nextIt;
  anon_class_16_2_91181a89 cloneInto;
  anon_class_24_3_8f1a74c6 saveState;
  undefined1 local_1d58 [32];
  DefParamVisitor v_1;
  anon_class_24_3_973e07f5 copyStateInto;
  SmallVector<BindEntry,_2UL> binds;
  SmallVector<OverrideEntry,_4UL> overrides;
  DefParamVisitor v;
  Compilation initialClone;
  
  name._M_str = "resolveDefParamsAndBinds";
  name._M_len = 0x18;
  TimeTraceScope::TimeTraceScope(&timeScope,name,(string_view)(ZEXT816(0x401ea3) << 0x40));
  overrides.super_SmallVectorBase<OverrideEntry>.data_ =
       (pointer)overrides.super_SmallVectorBase<OverrideEntry>.firstElement;
  overrides.super_SmallVectorBase<OverrideEntry>.len = 0;
  binds.super_SmallVectorBase<BindEntry>.data_ =
       (pointer)binds.super_SmallVectorBase<BindEntry>.firstElement;
  binds.super_SmallVectorBase<BindEntry>.len = 0;
  overrides.super_SmallVectorBase<OverrideEntry>.cap = 4;
  binds.super_SmallVectorBase<BindEntry>.cap = 2;
  saveState.overrides = &overrides;
  cloneInto.copyStateInto = &copyStateInto;
  copyStateInto.getNodeFor = &local_1dd5;
  saveState.binds = &binds;
  generateLevel = 0;
  numBlocksSeen = 0;
  uVar7 = 0;
  uVar4 = 0;
  checkProblem.this = this;
  cloneInto.this = this;
  saveState.this = this;
  copyStateInto.overrides = saveState.overrides;
  copyStateInto.binds = saveState.binds;
  do {
    v.found.stackBase[0] = '\0';
    v.found.stackBase[1] = '\0';
    v.found.stackBase[2] = '\0';
    v.found.stackBase[3] = '\0';
    v.found.stackBase[4] = '\0';
    v.found.stackBase[5] = '\0';
    v.found.stackBase[6] = '\0';
    v.found.stackBase[7] = '\0';
    v.found.stackBase[8] = '\0';
    v.found.stackBase[9] = '\0';
    v.found.stackBase[10] = '\0';
    v.found.stackBase[0xb] = '\0';
    v.found.stackBase[0xc] = '\0';
    v.found.stackBase[0xd] = '\0';
    v.found.stackBase[0xe] = '\0';
    v.found.stackBase[0xf] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.cap = 0;
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[0] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[1] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[2] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[3] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[4] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[5] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[6] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[7] = '\0';
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.data_ = (pointer)0x0;
    v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.len = 0;
    boost::unordered::
    unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::unordered_flat_map
              ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                *)&v);
    Compilation(&initialClone,(Bag *)&v,this->defaultLibPtr);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)&v);
    resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()(&cloneInto,&initialClone);
    nextIt.currBlocksSeen = &currBlocksSeen;
    nextIt.numBlocksSeen = &numBlocksSeen;
    nextIt.generateLevel = &generateLevel;
    while( true ) {
      DefParamVisitor::DefParamVisitor(&v,(ulong)(this->options).maxInstanceDepth,generateLevel);
      pRVar3 = getRoot(&initialClone,true);
      Symbol::visit<slang::ast::DefParamVisitor&>(&pRVar3->super_Symbol,&v);
      visitor = (Compilation *)&v;
      bVar2 = resolveDefParamsAndBinds::anon_class_8_1_8991fb9c::operator()(&checkProblem,&v);
      sVar6 = v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.len;
      if (bVar2) {
        DefParamVisitor::~DefParamVisitor(&v);
        goto LAB_001cc462;
      }
      currBlocksSeen = v.numBlocksSeen;
      if ((uVar4 < v.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.len) ||
         (uVar7 < (ulong)((long)initialClone.bindDirectives.
                                super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)initialClone.bindDirectives.
                                super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4))) {
        resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()(&saveState,&v,&initialClone);
        goto LAB_001cc179;
      }
      bVar2 = resolveDefParamsAndBinds::anon_class_24_3_a558fa90::operator()(&nextIt);
      if (bVar2) break;
      DefParamVisitor::~DefParamVisitor(&v);
    }
    resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()(&saveState,&v,&initialClone);
    sVar6 = uVar4;
LAB_001cc179:
    DefParamVisitor::~DefParamVisitor(&v);
    uVar4 = (long)initialClone.bindDirectives.
                  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)initialClone.bindDirectives.
                  super__Vector_base<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::BindDirectiveSyntax_*,_const_slang::ast::Scope_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar7 < uVar4) {
      sVar6 = 0;
      uVar7 = uVar4;
    }
    else {
      bVar2 = true;
      local_1dd4 = 0;
      while( true ) {
        if ((this->options).maxDefParamSteps <= local_1dd4) break;
        v_1.found.stackBase[0] = '\0';
        v_1.found.stackBase[1] = '\0';
        v_1.found.stackBase[2] = '\0';
        v_1.found.stackBase[3] = '\0';
        v_1.found.stackBase[4] = '\0';
        v_1.found.stackBase[5] = '\0';
        v_1.found.stackBase[6] = '\0';
        v_1.found.stackBase[7] = '\0';
        v_1.found.stackBase[8] = '\0';
        v_1.found.stackBase[9] = '\0';
        v_1.found.stackBase[10] = '\0';
        v_1.found.stackBase[0xb] = '\0';
        v_1.found.stackBase[0xc] = '\0';
        v_1.found.stackBase[0xd] = '\0';
        v_1.found.stackBase[0xe] = '\0';
        v_1.found.stackBase[0xf] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.cap = 0;
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[0] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[1] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[2] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[3] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[4] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[5] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[6] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.firstElement[7] = '\0';
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.data_ = (pointer)0x0;
        v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.len = 0;
        boost::unordered::
        unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
        ::unordered_flat_map
                  ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                    *)&v_1);
        Compilation((Compilation *)&v,(Bag *)&v_1,this->defaultLibPtr);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
        ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                       *)&v_1);
        resolveDefParamsAndBinds::anon_class_16_2_91181a89::operator()(&cloneInto,(Compilation *)&v)
        ;
        DefParamVisitor::DefParamVisitor(&v_1,(ulong)(this->options).maxInstanceDepth,generateLevel)
        ;
        pRVar3 = getRoot((Compilation *)&v,true);
        visitor = (Compilation *)&v_1;
        Symbol::visit<slang::ast::DefParamVisitor&>
                  (&pRVar3->super_Symbol,(DefParamVisitor *)visitor);
        bVar2 = resolveDefParamsAndBinds::anon_class_8_1_8991fb9c::operator()
                          (&checkProblem,(DefParamVisitor *)visitor);
        if (bVar2) {
LAB_001cc448:
          DefParamVisitor::~DefParamVisitor(&v_1);
          ~Compilation((Compilation *)&v);
LAB_001cc462:
          ~Compilation(&initialClone);
          this = visitor;
          goto LAB_001cc46f;
        }
        local_1dd0 = 0;
        while( true ) {
          if (v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.len <= local_1dd0)
          {
            DefParamVisitor::~DefParamVisitor(&v_1);
            ~Compilation((Compilation *)&v);
            goto LAB_001cc385;
          }
          this_00 = DefParamSymbol::getTarget
                              (v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.
                               data_[local_1dd0]);
          pOVar1 = overrides.super_SmallVectorBase<OverrideEntry>.data_;
          uVar4 = local_1dd0;
          if (this_00 == (Symbol *)0x0) {
            pSVar5 = (SyntaxNode *)0x0;
          }
          else {
            pSVar5 = this_00->originatingSyntax;
          }
          getRange.v = &v_1;
          getRange.j = &local_1dd0;
          if (((overrides.super_SmallVectorBase<OverrideEntry>.data_[local_1dd0].targetSyntax !=
                pSVar5) && (pSVar5 != (SyntaxNode *)0x0)) &&
             (overrides.super_SmallVectorBase<OverrideEntry>.data_[local_1dd0].targetSyntax !=
              (SyntaxNode *)0x0)) {
            pRVar3 = (this->root)._M_t.
                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
            SVar8 = resolveDefParamsAndBinds::anon_class_16_2_9473209d::operator()(&getRange);
            this_01 = Scope::addDiag(&pRVar3->super_Scope,(DiagCode)0xa000d,SVar8);
            Diagnostic::operator<<(this_01,&pOVar1[uVar4].pathStr);
            Symbol::getHierarchicalPath_abi_cxx11_((string *)local_1d58,this_00);
            visitor = (Compilation *)local_1d58;
            Diagnostic::operator<<(this_01,(string *)visitor);
            std::__cxx11::string::~string((string *)local_1d58);
            goto LAB_001cc448;
          }
          rhs = DefParamSymbol::getValue
                          (v_1.found.super_SmallVectorBase<const_slang::ast::DefParamSymbol_*>.data_
                           [local_1dd0]);
          bVar2 = slang::operator==(&pOVar1[uVar4].value,rhs);
          if (!bVar2) break;
          local_1dd0 = local_1dd0 + 1;
        }
        if (local_1dd4 == (this->options).maxDefParamSteps - 1) {
          pRVar3 = (this->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
          SVar8 = resolveDefParamsAndBinds::anon_class_16_2_9473209d::operator()(&getRange);
          Scope::addDiag(&pRVar3->super_Scope,(DiagCode)0x9000d,SVar8);
        }
        resolveDefParamsAndBinds::anon_class_24_3_8f1a74c6::operator()
                  (&saveState,&v_1,(Compilation *)&v);
        DefParamVisitor::~DefParamVisitor(&v_1);
        ~Compilation((Compilation *)&v);
        local_1dd4 = local_1dd4 + 1;
        bVar2 = false;
      }
      if (!bVar2) goto LAB_001cc3aa;
LAB_001cc385:
      bVar2 = resolveDefParamsAndBinds::anon_class_24_3_a558fa90::operator()(&nextIt);
      if (bVar2) {
LAB_001cc3aa:
        ~Compilation(&initialClone);
        resolveDefParamsAndBinds::anon_class_24_3_973e07f5::operator()(&copyStateInto,this,true);
LAB_001cc46f:
        SmallVectorBase<BindEntry>::cleanup
                  (&binds.super_SmallVectorBase<BindEntry>,(EVP_PKEY_CTX *)this);
        SmallVectorBase<OverrideEntry>::cleanup
                  (&overrides.super_SmallVectorBase<OverrideEntry>,(EVP_PKEY_CTX *)this);
        TimeTraceScope::~TimeTraceScope(&timeScope);
        return;
      }
    }
    ~Compilation(&initialClone);
    uVar4 = sVar6;
  } while( true );
}

Assistant:

void Compilation::resolveDefParamsAndBinds() {
    TimeTraceScope timeScope("resolveDefParamsAndBinds"sv, ""sv);

    struct OverrideEntry {
        OpaqueInstancePath path;
        const SyntaxNode* targetSyntax = nullptr;
        const SyntaxNode* defparamSyntax = nullptr;
        ConstantValue value;
        std::string pathStr;
    };
    SmallVector<OverrideEntry, 4> overrides;

    struct BindEntry {
        OpaqueInstancePath path;
        const ModuleDeclarationSyntax* definitionTarget = nullptr;
        BindDirectiveInfo info;
    };
    SmallVector<BindEntry> binds;

    auto getNodeFor = [](const OpaqueInstancePath& path, Compilation& c) {
        HierarchyOverrideNode* node = &c.hierarchyOverrides;
        for (auto& entry : path.entries)
            node = &node->childNodes[entry];
        return node;
    };

    auto copyStateInto = [&](Compilation& c, bool isFinal) {
        for (auto& entry : overrides) {
            if (!entry.targetSyntax)
                continue;

            SLANG_ASSERT(entry.defparamSyntax);

            auto node = getNodeFor(entry.path, c);
            auto [it, inserted] = node->paramOverrides.emplace(
                entry.targetSyntax, std::pair{entry.value, entry.defparamSyntax});

            if (!inserted && isFinal) {
                SLANG_ASSERT(it->second.second);
                auto& diag = c.root->addDiag(diag::DuplicateDefparam,
                                             entry.defparamSyntax->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, it->second.second->sourceRange());
            }
        }

        for (auto& entry : binds) {
            if (entry.definitionTarget) {
                if (!entry.path.empty()) {
                    // This is a nested definition, so we need to put the
                    // bind into the override node.
                    auto node = getNodeFor(entry.path, c);
                    node->binds.push_back({entry.info, entry.definitionTarget});
                }
                else {
                    auto def = c.getDefinition(*c.root, *entry.definitionTarget);
                    if (def) {
                        // const_cast is fine; we accessed the private data of the compilation
                        // through a public interface that added the const on top.
                        const_cast<DefinitionSymbol*>(def)->bindDirectives.push_back(entry.info);
                    }
                }
            }
            else {
                auto node = getNodeFor(entry.path, c);
                node->binds.push_back({entry.info, nullptr});
            }
        }
    };

    auto cloneInto = [&](Compilation& c) {
        c.diagsDisabled = true;
        c.options = options;
        for (auto& tree : syntaxTrees)
            c.addSyntaxTree(tree);

        copyStateInto(c, false);
    };

    auto saveState = [&](DefParamVisitor& visitor, Compilation& c) {
        overrides.clear();
        for (auto defparam : visitor.found) {
            auto target = defparam->getTarget();
            if (!target) {
                overrides.emplace_back();
            }
            else {
                overrides.push_back({OpaqueInstancePath(*target), target->getSyntax(),
                                     defparam->getSyntax(), defparam->getValue(),
                                     target->getHierarchicalPath()});
            }
        }

        // We make a copy of the bind directives list here because resolveBindTargets
        // can cause the compilation to add more entries to the list (for recursive
        // module instantiations).
        binds.clear();
        auto bindDirs = c.bindDirectives;
        for (auto [syntax, scope] : bindDirs) {
            ResolvedBind resolvedBind;
            c.resolveBindTargets(*syntax, *scope, resolvedBind);

            BindDirectiveInfo info;
            info.bindSyntax = syntax;

            auto& def = resolvedBind.instanceDef;
            info.configRuleSyntax = def.configRule ? def.configRule->syntax.get() : nullptr;
            info.configBlockSyntax = def.configRoot ? def.configRoot->getSyntax() : nullptr;
            info.instantiationDefSyntax = def.definition ? def.definition->getSyntax() : nullptr;
            info.isNewConfigRoot = def.configRoot != nullptr;
            if (!info.isNewConfigRoot && resolvedBind.resolvedConfig) {
                info.configBlockSyntax = resolvedBind.resolvedConfig->useConfig.getSyntax();

                // Make a copy of the list; the memory for it is owned by
                // the old compilation that is going away.
                info.liblist = copyFrom(resolvedBind.resolvedConfig->liblist);
            }

            for (auto target : resolvedBind.instTargets)
                binds.emplace_back(BindEntry{OpaqueInstancePath(*target), nullptr, info});

            if (auto defTarget = resolvedBind.defTarget) {
                auto parentScope = defTarget->getParentScope();
                auto defSyntax = defTarget->getSyntax();
                SLANG_ASSERT(parentScope && defSyntax);

                // If this is a nested definition we'll put it into the
                // override node of the parent scope that contains the
                // definition. Otherwise it's a globally targeted bind.
                OpaqueInstancePath path;
                auto& parentSym = parentScope->asSymbol();
                if (parentSym.kind != SymbolKind::CompilationUnit)
                    path = OpaqueInstancePath(parentSym);

                binds.emplace_back(
                    BindEntry{std::move(path), &defSyntax->as<ModuleDeclarationSyntax>(), info});
            }
        }
    };

    auto checkProblem = [&](const DefParamVisitor& visitor) {
        if (visitor.hierarchyProblem) {
            auto& diag = root->addDiag(diag::MaxInstanceDepthExceeded,
                                       visitor.hierarchyProblem->location);
            diag << visitor.hierarchyProblem->getDefinition().getKindString();
            diag << options.maxInstanceDepth;
            return true;
        }
        return false;
    };

    // [23.10.4.1] gives an algorithm for elaboration in the face of defparams.
    // Specifically, we need to resolve all possible defparams at one "level" of
    // hierarchy before moving on to a deeper level, where a "level" in this case
    // is each successive set of nested generate blocks.
    size_t generateLevel = 0;
    size_t numBlocksSeen = 0;
    size_t numBindsSeen = 0;
    size_t numDefParamsSeen = 0;
    while (true) {
        // Traverse the design and find all defparams and their values.
        // defparam resolution happens in a cloned compilation unit because we will be
        // constantly mucking with parameter values in ways that can change the actual
        // hierarchy that gets instantiated. Cloning lets us do that in an isolated context
        // and throw that work away once we know the final parameter values.
        Compilation initialClone({}, defaultLibPtr);
        cloneInto(initialClone);

        size_t currBlocksSeen;
        auto nextIt = [&] {
            // If we haven't found any new blocks we're done iterating.
            SLANG_ASSERT(currBlocksSeen >= numBlocksSeen);
            if (currBlocksSeen == numBlocksSeen)
                return true;

            // Otherwise advance into the next blocks and try again.
            generateLevel++;
            numBlocksSeen = currBlocksSeen;
            return false;
        };

        while (true) {
            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            initialClone.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            currBlocksSeen = v.numBlocksSeen;
            if (v.found.size() > numDefParamsSeen ||
                initialClone.bindDirectives.size() > numBindsSeen) {
                numDefParamsSeen = v.found.size();
                saveState(v, initialClone);
                break;
            }

            // We didn't find any more binds or defparams so increase
            // our generate level and try again.
            if (nextIt()) {
                saveState(v, initialClone);
                break;
            }
        }

        // If we have found more binds, do another visit to let them be applied
        // and potentially add blocks and defparams to our set for this level.
        if (initialClone.bindDirectives.size() > numBindsSeen) {
            // Reset the number of defparams seen to ensure that
            // we re-resolve everything after the next iteration.
            numDefParamsSeen = 0;
            numBindsSeen = initialClone.bindDirectives.size();
            continue;
        }

        // defparams can change the value of parameters, further affecting the value of
        // other defparams elsewhere in the design. This means we need to iterate,
        // reevaluating defparams until they all settle to a stable value or until we
        // give up due to the potential of cyclical references.
        bool allSame = true;
        for (uint32_t i = 0; i < options.maxDefParamSteps; i++) {
            Compilation c({}, defaultLibPtr);
            cloneInto(c);

            DefParamVisitor v(options.maxInstanceDepth, generateLevel);
            c.getRoot(/* skipDefParamsAndBinds */ true).visit(v);
            if (checkProblem(v))
                return;

            // We're only done if we have the same set of defparams with the same set of values.
            allSame = true;
            SLANG_ASSERT(v.found.size() == overrides.size());
            for (size_t j = 0; j < v.found.size(); j++) {
                // Check that the defparam resolved to the same target we saw previously.
                // The spec declares it to be an error if a defparam target changes based
                // on elaboration of other defparam values.
                const SyntaxNode* targetNode = nullptr;
                auto target = v.found[j]->getTarget();
                if (target)
                    targetNode = target->getSyntax();

                auto getRange = [&] {
                    auto syntax = v.found[j]->getSyntax();
                    SLANG_ASSERT(syntax);
                    return syntax->sourceRange();
                };

                auto& prevEntry = overrides[j];
                if (prevEntry.targetSyntax && targetNode && prevEntry.targetSyntax != targetNode) {
                    auto& diag = root->addDiag(diag::DefParamTargetChange, getRange());
                    diag << prevEntry.pathStr;
                    diag << target->getHierarchicalPath();
                    return;
                }

                if (prevEntry.value != v.found[j]->getValue()) {
                    allSame = false;
                    if (i == options.maxDefParamSteps - 1)
                        root->addDiag(diag::DefParamCycle, getRange());
                    break;
                }
            }

            if (allSame)
                break;

            saveState(v, c);
        }

        // If we gave up due to a potential infinite loop, continue exiting.
        if (!allSame)
            break;

        if (nextIt())
            break;
    }

    // We have our final overrides; copy them into the main compilation unit.
    copyStateInto(*this, true);
}